

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O1

int __thiscall
cinatra::coro_http_client::connect(coro_http_client *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  element_type *peVar1;
  undefined4 in_register_00000034;
  
  peVar1 = (element_type *)operator_new(0x98,(nothrow_t *)&std::nothrow);
  if (peVar1 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> = connect;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)connect;
    (((http_header *)((long)(peVar1->parser_).headers_._M_elems + 0x40))->name)._M_len =
         (size_t)__addr;
    *(char **)((long)(peVar1->parser_).headers_._M_elems + 0x38) =
         (char *)CONCAT44(in_register_00000034,__fd);
    *(undefined8 *)&peVar1->parser_ = 0;
    (peVar1->parser_).msg_._M_len = 0;
    (peVar1->parser_).msg_._M_str = (char *)0x0;
    *(undefined1 *)((long)(peVar1->parser_).headers_._M_elems + 0x18) = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    *(undefined1 *)((long)(peVar1->parser_).headers_._M_elems + 0x48) = 0;
  }
  return (int)this;
}

Assistant:

async_simple::coro::Lazy<resp_data> connect(const uri_t &u) {
    if (socket_->has_closed_) {
      socket_->is_timeout_ = false;
      host_ = proxy_host_.empty() ? u.get_host() : proxy_host_;
      port_ = proxy_port_.empty() ? u.get_port() : proxy_port_;
      if (auto ec = co_await coro_io::async_connect(
              &executor_wrapper_, socket_->impl_, host_, port_);
          ec) {
        co_return resp_data{ec, 404};
      }

#ifdef INJECT_FOR_HTTP_CLIENT_TEST
      if (connect_timeout_forever_) {
        socket_->is_timeout_ = true;
      }
#endif
      if (socket_->is_timeout_) {
        auto ec = std::make_error_code(std::errc::timed_out);
        co_return resp_data{ec, 404};
      }

      if (enable_tcp_no_delay_) {
        std::error_code ec;
        socket_->impl_.set_option(asio::ip::tcp::no_delay(true), ec);
        if (ec) {
          co_return resp_data{ec, 404};
        }
      }

      if (u.is_ssl) {
#ifdef CINATRA_ENABLE_SSL
        if (!has_init_ssl_) {
          size_t pos = u.host.find("www.");
          std::string host;
          if (pos != std::string_view::npos) {
            host = std::string{u.host.substr(pos + 4)};
          }
          else {
            host = std::string{u.host};
          }
          bool r = init_ssl(asio::ssl::verify_none, "", host);
          if (!r) {
            co_return resp_data{
                std::make_error_code(std::errc::invalid_argument), 404};
          }
        }
#endif
        if (auto ec = co_await handle_shake(); ec) {
          co_return resp_data{ec, 404};
        }
      }
      socket_->has_closed_ = false;
    }

    co_return resp_data{};
  }